

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunArrayToElements(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint uVar1;
  VmInstruction *pVVar2;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  VmValue *dst;
  TypeBase *type;
  VmValue *value_00;
  VmInstruction *instruction;
  VmConstant *address;
  VmValue *value_01;
  TypeBase *type_00;
  VmValue *pVVar5;
  ulong uVar6;
  VmBlock **ppVVar7;
  uint in_stack_ffffffffffffff88;
  
  if (value != (VmValue *)0x0) {
    if (value->typeID == 3) {
      ppVVar7 = &module->currentBlock;
      module->currentBlock = (VmBlock *)value;
      pVVar2 = (VmInstruction *)value[1].comment.end;
joined_r0x001b4249:
      instruction = pVVar2;
      if (instruction != (VmInstruction *)0x0) {
        pVVar2 = instruction->nextSibling;
        if (instruction->cmd == VM_INST_STORE_STRUCT) {
          uVar1 = (instruction->arguments).count;
          if ((uVar1 != 0) && (uVar1 != 1)) {
            ppVVar3 = (instruction->arguments).data;
            pVVar5 = ppVVar3[1];
            if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
              pVVar5 = (VmValue *)0x0;
            }
            if (2 < uVar1) {
              pVVar4 = ppVVar3[2];
              if ((((pVVar4 != (VmValue *)0x0) && (pVVar4->typeID == 2)) &&
                  (*(int *)&pVVar4[1]._vptr_VmValue == 0x4a)) && ((pVVar4->users).count == 1)) {
                dst = *ppVVar3;
                value[1].users.data = (VmValue **)instruction;
                type_00 = (pVVar4->type).structType;
                if ((type_00 == (TypeBase *)0x0) || (type_00->typeID != 0x13)) {
                  type_00 = (TypeBase *)0x0;
                }
                type = (TypeBase *)type_00[1]._vptr_TypeBase;
                address = anon_unknown.dwarf_12e14a::CreateAlloca
                                    (ctx,module,(instruction->super_VmValue).source,type_00,
                                     "array_elem",true);
                if (pVVar4[1].type.type != VM_TYPE_VOID) {
                  uVar6 = 0;
                  do {
                    value_00 = *(VmValue **)(*(long *)&pVVar4[1].typeID + uVar6 * 8);
                    if ((value_00 == (VmValue *)0x0) || (value_00->typeID != 2)) {
                      in_stack_ffffffffffffff88 = (int)type->size * (int)uVar6;
                      anon_unknown.dwarf_12e14a::CreateStore
                                (ctx,module,(instruction->super_VmValue).source,type,
                                 &address->super_VmValue,value_00,in_stack_ffffffffffffff88);
                    }
                    else {
                      value_01 = value_00;
                      if (*(int *)&value_00[1]._vptr_VmValue == 0x11) {
                        if (value_00[1].type.type == VM_TYPE_VOID) goto LAB_001b4469;
                        value_01 = (VmValue *)**(undefined8 **)&value_00[1].typeID;
                      }
                      value[1].users.data = (VmValue **)value_00;
                      in_stack_ffffffffffffff88 = (int)type->size * (int)uVar6;
                      anon_unknown.dwarf_12e14a::CreateStore
                                (ctx,module,(instruction->super_VmValue).source,type,
                                 &address->super_VmValue,value_01,in_stack_ffffffffffffff88);
                      value[1].users.data = (VmValue **)instruction;
                    }
                    uVar6 = uVar6 + 1;
                  } while (uVar6 < pVVar4[1].type.type);
                }
                anon_unknown.dwarf_12e14a::CreateMemCopy
                          (module,(instruction->super_VmValue).source,dst,
                           *(uint *)&pVVar5[1]._vptr_VmValue,&address->super_VmValue,
                           (uint)type_00->size,in_stack_ffffffffffffff88);
                value[1].users.data = *(VmValue ***)&value[1].hasSideEffects;
                VmBlock::RemoveInstruction((VmBlock *)value,instruction);
              }
              goto joined_r0x001b4249;
            }
          }
LAB_001b4469:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        goto joined_r0x001b4249;
      }
    }
    else {
      if (value->typeID != 4) {
        return;
      }
      ppVVar7 = (VmBlock **)&module->currentFunction;
      module->currentFunction = (VmFunction *)value;
      for (pVVar5 = (VmValue *)value[1].source; pVVar5 != (VmValue *)0x0;
          pVVar5 = (VmValue *)pVVar5[1].comment.begin) {
        RunArrayToElements(ctx,module,pVVar5);
      }
    }
    *ppVVar7 = (VmBlock *)0x0;
  }
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}